

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

XMLCh * __thiscall PSVIWriterHandlers::getIdName(PSVIWriterHandlers *this,XSObject *obj)

{
  char16_t *toAdd;
  char16_t *local_28;
  XMLCh *idName;
  XMLCh *objLoc;
  XSObject *obj_local;
  PSVIWriterHandlers *this_local;
  
  toAdd = (char16_t *)operator_new__(0x12);
  xercesc_4_0::XMLString::sizeToText
            ((ulong)obj,toAdd,8,0x10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_28 = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                       (this->fIdMap,toAdd);
  if (local_28 == (char16_t *)0x0) {
    local_28 = createID(this,obj);
    xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
              (this->fIdMap,toAdd,local_28);
    xercesc_4_0::BaseRefVectorOf<char16_t>::addElement
              (&this->fObjectLocations->super_BaseRefVectorOf<char16_t>,toAdd);
  }
  else if (toAdd != (char16_t *)0x0) {
    operator_delete__(toAdd);
  }
  return local_28;
}

Assistant:

const XMLCh* PSVIWriterHandlers::getIdName(XSObject* obj) {
	XMLCh* objLoc = new XMLCh[9];
	XMLString::sizeToText((XMLSize_t)obj, objLoc, 8, 16);
	XMLCh* idName = fIdMap->get(objLoc);
	if (!idName) {
		idName = createID(obj);
		fIdMap->put(objLoc, idName);
		fObjectLocations->addElement(objLoc);
	} else {
		delete[] objLoc;
	}
	return idName;
}